

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdpvi.cpp
# Opt level: O0

void __thiscall acasx::MDPVI::storeQValues(MDPVI *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  reference piVar6;
  size_type sVar7;
  double dVar8;
  double QValue;
  int *a;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vector<int,_std::allocator<int>_> actions;
  int i_1;
  int k;
  int i;
  int index;
  ofstream actionFileWriter;
  ostream local_420 [8];
  ofstream costFileWriter;
  ostream local_210 [8];
  ofstream indexFileWriter;
  MDPVI *this_local;
  
  std::ofstream::ofstream(local_210);
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((char *)local_210,0x11b629);
  std::ofstream::ofstream(local_420);
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((char *)local_420,0x11b6e1);
  std::ofstream::ofstream(&i);
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((char *)&i,0x11b6fe);
  bVar1 = std::ofstream::is_open();
  if ((((bVar1 & 1) != 0) && (bVar1 = std::ofstream::is_open(), (bVar1 & 1) != 0)) &&
     (bVar1 = std::ofstream::is_open(), (bVar1 & 1) != 0)) {
    k = 0;
    for (i_1 = 0; iVar3 = MDP::getCStatesNum(this->mdp), i_1 < iVar3; i_1 = i_1 + 1) {
      poVar5 = (ostream *)std::ostream::operator<<(local_210,k);
      std::operator<<(poVar5,"\n");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&i,0);
      std::operator<<(poVar5,"\n");
      k = k + 1;
      poVar5 = (ostream *)std::ostream::operator<<(local_420,(*this->U)[i_1]);
      std::operator<<(poVar5,"\n");
    }
    for (actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 1;
        actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < 0x16;
        actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1) {
      for (actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._0_4_ = 0;
          iVar3 = (int)actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
          iVar4 = MDP::getCStatesNum(this->mdp), iVar3 < iVar4;
          actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ =
               (int)actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 1) {
        MDP::actions((vector<int,_std::allocator<int>_> *)&__range3,this->mdp,
                     (int)actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        poVar5 = (ostream *)std::ostream::operator<<(local_210,k);
        std::operator<<(poVar5,"\n");
        __end3 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)&__range3);
        a = (int *)std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)&__range3);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           *)&a), bVar2) {
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end3);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&i,*piVar6);
          std::operator<<(poVar5,"\n");
          dVar8 = getQValue(this,actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,*piVar6);
          poVar5 = (ostream *)std::ostream::operator<<(local_420,dVar8);
          std::operator<<(poVar5,"\n");
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end3);
        }
        sVar7 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&__range3);
        k = k + (int)sVar7;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)&__range3);
      }
    }
    poVar5 = (ostream *)std::ostream::operator<<(local_210,k);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)&i,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(local_420,std::endl<char,std::char_traits<char>>);
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::~ofstream(&i);
    std::ofstream::~ofstream(local_420);
    std::ofstream::~ofstream(local_210);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"failure in opening files");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  abort();
}

Assistant:

void MDPVI::storeQValues()
{
    ofstream indexFileWriter;
    indexFileWriter.open("indexFile", ios_base::out|ios_base::trunc);
    ofstream costFileWriter;
    costFileWriter.open("costFile", ios_base::out|ios_base::trunc);
    ofstream actionFileWriter;
    actionFileWriter.open("actionFile", ios_base::out|ios_base::trunc);

    if(!indexFileWriter.is_open() || !costFileWriter.is_open() || !actionFileWriter.is_open())
    {
        cerr<<"failure in opening files"<<endl;
        abort();
    }

    int index=0;
    for (int i=0; i<mdp->getCStatesNum(); ++i)//T=k=0
    {
        indexFileWriter<<index<<"\n";
        actionFileWriter<<0<<"\n";  //leaving states, using O to avoid arrayIndexOutofRange problem
        index++;
        costFileWriter<<U[0][i]<<"\n";
    }

    for(int k=1; k<=TIME_HORIZON+1; ++k )
    {
        for (int i=0; i<mdp->getCStatesNum();++i)
        {
            vector<int> actions=mdp->actions(i);
            indexFileWriter<<index<<"\n";
            for (int& a :actions )
            {
                actionFileWriter<<a<<"\n";
                double QValue = getQValue(k, i, a);
                costFileWriter<<QValue<<"\n";
            }
            index+=actions.size();
        }
    }

    indexFileWriter<<index<<endl;
    actionFileWriter<<endl;
    costFileWriter<<endl;

    indexFileWriter.close();
    costFileWriter.close();
    actionFileWriter.close();

}